

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O1

void vp9_unref_frame(VP9Context *s,VP9Frame *f)

{
  RK_S32 index;
  RefInfo *pRVar1;
  int iVar2;
  MppBuffer framebuf;
  MppBuffer local_20;
  
  pRVar1 = f->ref;
  if ((0 < pRVar1->ref_count) && (index = f->slot_index, index < 0x7f)) {
    iVar2 = pRVar1->ref_count + -1;
    pRVar1->ref_count = iVar2;
    if (iVar2 == 0) {
      if ((pRVar1->invisible != 0) && (pRVar1->is_output == 0)) {
        local_20 = (MppBuffer)0x0;
        mpp_buf_slot_get_prop(s->slots,index,SLOT_BUFFER,&local_20);
        mpp_buffer_put_with_caller(local_20,"vp9_unref_frame");
        f->ref->invisible = 0;
      }
      mpp_buf_slot_clr_flag(s->slots,f->slot_index,SLOT_CODEC_USE);
      mpp_osal_free("vp9_unref_frame",f->ref);
      f->slot_index = 0xff;
      f->ref = (RefInfo *)0x0;
    }
    f->ref = (RefInfo *)0x0;
    return;
  }
  _mpp_log_l(2,(char *)0x0,"ref count alreay is zero",(char *)0x0);
  return;
}

Assistant:

static void vp9_unref_frame( VP9Context *s, VP9Frame *f)
{
    if (f->ref->ref_count <= 0 || f->slot_index >= 0x7f) {
        mpp_err("ref count alreay is zero");
        return;
    }
    f->ref->ref_count--;
    if (!f->ref->ref_count) {
        if (f->slot_index <= 0x7f) {
            if (f->ref->invisible && !f->ref->is_output) {
                MppBuffer framebuf = NULL;

                mpp_buf_slot_get_prop(s->slots, f->slot_index, SLOT_BUFFER, &framebuf);
                mpp_buffer_put(framebuf);
                f->ref->invisible = 0;
            }
            mpp_buf_slot_clr_flag(s->slots, f->slot_index, SLOT_CODEC_USE);
        }
        mpp_free(f->ref);
        f->slot_index = 0xff;
        f->ref = NULL;
    }
    f->ref = NULL;
    return;
}